

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O0

void __thiscall
icu_63::ComposeNormalizer2::normalizeUTF8
          (ComposeNormalizer2 *this,uint32_t options,StringPiece src,ByteSink *sink,Edits *edits,
          UErrorCode *errorCode)

{
  Normalizer2Impl *this_00;
  UBool UVar1;
  int32_t iVar2;
  uint8_t *src_00;
  uint8_t *s;
  Edits *edits_local;
  ByteSink *sink_local;
  uint32_t options_local;
  ComposeNormalizer2 *this_local;
  StringPiece src_local;
  
  this_local = (ComposeNormalizer2 *)src.ptr_;
  src_local.ptr_._0_4_ = src.length_;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((edits != (Edits *)0x0) && ((options & 0x2000) == 0)) {
      Edits::reset(edits);
    }
    src_00 = (uint8_t *)StringPiece::data((StringPiece *)&this_local);
    this_00 = (this->super_Normalizer2WithImpl).impl;
    UVar1 = this->onlyContiguous;
    iVar2 = StringPiece::length((StringPiece *)&this_local);
    Normalizer2Impl::composeUTF8(this_00,options,UVar1,src_00,src_00 + iVar2,sink,edits,errorCode);
    (*sink->_vptr_ByteSink[4])();
  }
  return;
}

Assistant:

void
    normalizeUTF8(uint32_t options, StringPiece src, ByteSink &sink,
                  Edits *edits, UErrorCode &errorCode) const U_OVERRIDE {
        if (U_FAILURE(errorCode)) {
            return;
        }
        if (edits != nullptr && (options & U_EDITS_NO_RESET) == 0) {
            edits->reset();
        }
        const uint8_t *s = reinterpret_cast<const uint8_t *>(src.data());
        impl.composeUTF8(options, onlyContiguous, s, s + src.length(),
                         &sink, edits, errorCode);
        sink.Flush();
    }